

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool TestCompressionF<Counter<unsigned_long,64u>,Counter<unsigned_char,8u>>(int bias)

{
  ulong uVar1;
  long lVar2;
  Counter<unsigned_long,_64U> fullOriginal;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long absDiff;
  uint recent;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  lVar2 = 0;
  uVar3 = 0;
  bVar9 = false;
  do {
    uVar4 = uVar3 & 0xff;
    uVar7 = 0;
    uVar1 = uVar3;
    do {
      if (uVar7 < uVar3) {
        if ((long)uVar1 < (long)(0x80 - bias)) {
LAB_001028a3:
          uVar8 = (uint)uVar7 & 0x100 | uVar4;
          uVar5 = uVar7 & 0xff;
          if (uVar5 < uVar4) {
            uVar6 = uVar8 - 0x100;
            if (uVar4 - uVar5 < 0x80U - (long)bias) {
              uVar6 = uVar8;
            }
          }
          else {
            uVar6 = uVar8 + 0x100;
            if (uVar5 - uVar4 <= (long)bias + 0x80U) {
              uVar6 = uVar8;
            }
          }
          if (uVar6 != uVar3) {
            return bVar9;
          }
          if ((bias == 0) && (uVar3 - (long)(char)uVar1 != uVar7)) {
            return bVar9;
          }
        }
      }
      else if ((long)(lVar2 + uVar7) <= (long)(bias + 0x80)) goto LAB_001028a3;
      uVar7 = uVar7 + 1;
      uVar1 = uVar1 - 1;
    } while (uVar7 != 0x200);
    bVar9 = 0x1fe < uVar3;
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + -1;
    if (uVar3 == 0x200) {
      return true;
    }
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}